

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Operation<short,int,duckdb::ArgMinMaxState<short,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<short,_int> *state,short *x,int *y,AggregateBinaryInput *binary)

{
  bool bVar1;
  ArgMinMaxState<short,_int> *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  int *in_RSI;
  byte *in_RDI;
  AggregateBinaryInput *in_stack_ffffffffffffffd0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffd8;
  
  if ((*in_RDI & 1) == 0) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffffd8,(idx_t)in_stack_ffffffffffffffd0);
    if (bVar1) {
      TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDX,(idx_t)in_RSI);
      Assign<short,int,duckdb::ArgMinMaxState<short,int>>
                (in_RCX,(short *)in_RDX,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
      *in_RDI = 1;
    }
  }
  else {
    Execute<short,int,duckdb::ArgMinMaxState<short,int>>
              (in_RCX,(short)((ulong)in_stack_ffffffffffffffd8 >> 0x30),
               (int)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}